

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlAssignRandom(Ssw_Sml_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  int local_28;
  int local_24;
  int f;
  int i;
  uint *pSims;
  Aig_Obj_t *pObj_local;
  Ssw_Sml_t *p_local;
  
  iVar1 = Aig_ObjIsCi(pObj);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x205,"void Ssw_SmlAssignRandom(Ssw_Sml_t *, Aig_Obj_t *)");
  }
  puVar3 = Ssw_ObjSim(p,pObj->Id);
  for (local_24 = 0; local_24 < p->nWordsTotal; local_24 = local_24 + 1) {
    uVar2 = Ssw_ObjRandomSim();
    puVar3[local_24] = uVar2;
  }
  if (p->nWordsFrame * p->nFrames == p->nWordsTotal) {
    for (local_28 = 0; local_28 < p->nFrames; local_28 = local_28 + 1) {
      iVar1 = p->nWordsFrame * local_28;
      puVar3[iVar1] = puVar3[iVar1] << 1;
    }
    return;
  }
  __assert_fail("p->nWordsFrame * p->nFrames == p->nWordsTotal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                ,0x20a,"void Ssw_SmlAssignRandom(Ssw_Sml_t *, Aig_Obj_t *)");
}

Assistant:

void Ssw_SmlAssignRandom( Ssw_Sml_t * p, Aig_Obj_t * pObj )
{
    unsigned * pSims;
    int i, f;
    assert( Aig_ObjIsCi(pObj) );
    pSims = Ssw_ObjSim( p, pObj->Id );
    for ( i = 0; i < p->nWordsTotal; i++ )
        pSims[i] = Ssw_ObjRandomSim();
    // set the first bit 0 in each frame
    assert( p->nWordsFrame * p->nFrames == p->nWordsTotal );
    for ( f = 0; f < p->nFrames; f++ )
        pSims[p->nWordsFrame*f] <<= 1;
}